

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGValidateDefinitionList
              (xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict defines)

{
  int iVar1;
  int iVar2;
  
  if (defines == (xmlRelaxNGDefinePtr_conflict)0x0) {
    xmlRelaxNGAddValidError
              (ctxt,XML_RELAXNG_ERR_INTERNAL,(xmlChar *)"NULL definition list",(xmlChar *)0x0,0);
    iVar2 = -1;
  }
  else {
    iVar2 = 0;
    for (; defines != (xmlRelaxNGDefinePtr_conflict)0x0; defines = defines->next) {
      if ((ctxt->state == (xmlRelaxNGValidStatePtr)0x0) &&
         (ctxt->states == (xmlRelaxNGStatesPtr)0x0)) {
        xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_NOSTATE,(xmlChar *)0x0,(xmlChar *)0x0,0);
        return -1;
      }
      iVar1 = xmlRelaxNGValidateDefinition(ctxt,defines);
      if (iVar1 < 0) {
        iVar2 = -1;
      }
      if (iVar1 == -1) {
        return iVar2;
      }
    }
  }
  return iVar2;
}

Assistant:

static int
xmlRelaxNGValidateDefinitionList(xmlRelaxNGValidCtxtPtr ctxt,
                                 xmlRelaxNGDefinePtr defines)
{
    int ret = 0, res;


    if (defines == NULL) {
        VALID_ERR2(XML_RELAXNG_ERR_INTERNAL,
                   BAD_CAST "NULL definition list");
        return (-1);
    }
    while (defines != NULL) {
        if ((ctxt->state != NULL) || (ctxt->states != NULL)) {
            res = xmlRelaxNGValidateDefinition(ctxt, defines);
            if (res < 0)
                ret = -1;
        } else {
            VALID_ERR(XML_RELAXNG_ERR_NOSTATE);
            return (-1);
        }
        if (res == -1)          /* continues on -2 */
            break;
        defines = defines->next;
    }

    return (ret);
}